

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

Aig_Obj_t *
Dar_BalanceBuildSuperTop
          (Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel,int nLutSize)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vSuper_00;
  void **ppvVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  int iVar9;
  int local_60;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darBalance.c"
                  ,0x1cf,
                  "Aig_Obj_t *Dar_BalanceBuildSuperTop(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int, int)"
                 );
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Aig_NodeCompareLevelsDecrease);
  iVar9 = vSuper->nSize;
  if (1 < iVar9) {
    iVar4 = 8;
    if (6 < nLutSize - 1U) {
      iVar4 = nLutSize;
    }
    do {
      vSuper_00 = (Vec_Ptr_t *)malloc(0x10);
      vSuper_00->nSize = 0;
      vSuper_00->nCap = iVar4;
      if (iVar4 == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = (void **)malloc((long)iVar4 << 3);
      }
      vSuper_00->pArray = ppvVar6;
      uVar8 = (ulong)(iVar9 - 1);
      local_60 = 0;
      do {
        if (vSuper->nSize < iVar9) goto LAB_004f110f;
        pAVar7 = (Aig_Obj_t *)vSuper->pArray[uVar8];
        iVar5 = Aig_BaseSize(p,pAVar7,nLutSize);
        local_60 = local_60 + iVar5;
        if ((nLutSize < local_60) && (1 < vSuper_00->nSize)) break;
        uVar1 = vSuper_00->nSize;
        uVar2 = vSuper_00->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vSuper_00->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vSuper_00->pArray,0x80);
            }
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar2 * 2;
            if (iVar5 <= (int)uVar2) goto LAB_004f105f;
            if (vSuper_00->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vSuper_00->pArray,(ulong)uVar2 << 4);
            }
          }
          vSuper_00->pArray = ppvVar6;
          vSuper_00->nCap = iVar5;
        }
LAB_004f105f:
        vSuper_00->nSize = uVar1 + 1;
        vSuper_00->pArray[(int)uVar1] = pAVar7;
        uVar8 = uVar8 - 1;
        bVar3 = 1 < iVar9;
        iVar9 = iVar9 + -1;
      } while (bVar3);
      if (vSuper_00->nSize < 0) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      vSuper->nSize = vSuper->nSize - vSuper_00->nSize;
      pAVar7 = Dar_BalanceBuildSuper(p,vSuper_00,Type,fUpdateLevel);
      if (vSuper_00->pArray != (void **)0x0) {
        free(vSuper_00->pArray);
        vSuper_00->pArray = (void **)0x0;
      }
      free(vSuper_00);
      Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar7,(uint)(Type == AIG_OBJ_EXOR));
      iVar9 = vSuper->nSize;
    } while (1 < iVar9);
  }
  if (iVar9 == 1) {
    return (Aig_Obj_t *)*vSuper->pArray;
  }
LAB_004f110f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuperTop( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel, int nLutSize )
{
    Vec_Ptr_t * vSubset;
    Aig_Obj_t * pObj;
    int i, nBaseSizeAll, nBaseSize;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // add one LUT at a time
    while ( Vec_PtrSize(vSuper) > 1 )
    {
        // isolate the group of nodes with nLutSize inputs
        nBaseSizeAll = 0;
        vSubset = Vec_PtrAlloc( nLutSize );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vSuper, pObj, i )
        {
            nBaseSize = Aig_BaseSize( p, pObj, nLutSize );
            if ( nBaseSizeAll + nBaseSize > nLutSize && Vec_PtrSize(vSubset) > 1 )
                break;
            nBaseSizeAll += nBaseSize;
            Vec_PtrPush( vSubset, pObj );
        }
        // remove them from vSuper
        Vec_PtrShrink( vSuper, Vec_PtrSize(vSuper) - Vec_PtrSize(vSubset) );
        // create the new supergate
        pObj = Dar_BalanceBuildSuper( p, vSubset, Type, fUpdateLevel );
        Vec_PtrFree( vSubset );
        // add the new output
        Dar_BalancePushUniqueOrderByLevel( vSuper, pObj, Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}